

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

ctrl_t * phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::unique_ptr<void*,std::default_delete<void*>>>,std::allocator<std::unique_ptr<void*,std::default_delete<void*>>>>>
                   (void)

{
  return EmptyGroup<std::is_same<std::allocator<std::unique_ptr<void_*,_std::default_delete<void_*>_>_>,_std::allocator<std::unique_ptr<void_*,_std::default_delete<void_*>_>_>_>_>
         ::empty_group;
}

Assistant:

inline ctrl_t* EmptyGroup() {
  PHMAP_IF_CONSTEXPR (std_alloc_t::value) {
      alignas(16) static constexpr ctrl_t empty_group[] = {
          kSentinel, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty,
          kEmpty,    kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty};

      return const_cast<ctrl_t*>(empty_group);
  } else {
       return nullptr;
  }
}